

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice.cpp
# Opt level: O3

int __thiscall
ncnn::Slice::forward
          (Slice *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  Mat *pMVar1;
  int iVar2;
  uint uVar3;
  pointer pMVar4;
  size_t _elemsize;
  void *pvVar5;
  Allocator *pAVar6;
  int *piVar7;
  long lVar8;
  long *plVar9;
  void *pvVar10;
  void *pvVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  pointer pMVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  long *plVar20;
  int iVar21;
  long lVar22;
  ulong uVar23;
  ulong local_a0;
  int local_98;
  
  pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar17 = pMVar4->dims;
  _elemsize = pMVar4->elemsize;
  pvVar5 = (this->slices).data;
  if (uVar17 == 1) {
    pMVar16 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    lVar12 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)pMVar16;
    if (lVar12 != 0) {
      iVar2 = pMVar4->w;
      uVar13 = (lVar12 >> 3) * 0x6db6db6db6db6db7;
      lVar12 = 0;
      lVar22 = 0xc;
      iVar18 = 0;
      uVar23 = 0;
      do {
        iVar21 = *(int *)((long)pvVar5 + uVar23 * 4);
        if (iVar21 == -0xe9) {
          iVar21 = (int)((ulong)((long)iVar2 - (long)iVar18) / (uVar13 + lVar12));
        }
        plVar20 = (long *)((long)pMVar16 + lVar22 * 4 + -0x30);
        pAVar6 = opt->blob_allocator;
        lVar14 = (long)iVar21;
        if ((((*(int *)((long)pMVar16 + lVar22 * 4 + -0x10) == 1) &&
             (*(int *)((long)pMVar16 + lVar22 * 4 + -0xc) == iVar21)) &&
            (*(size_t *)((long)pMVar16 + lVar22 * 4 + -0x20) == _elemsize)) &&
           (*(Allocator **)((long)pMVar16 + lVar22 * 4 + -0x18) == pAVar6)) {
          pvVar10 = (void *)*plVar20;
          if (pvVar10 == (void *)0x0) {
            return -100;
          }
        }
        else {
          piVar7 = *(int **)((long)pMVar16 + lVar22 * 4 + -0x28);
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + -1;
            UNLOCK();
            if (*piVar7 == 0) {
              lVar8 = *(long *)((long)pMVar16 + lVar22 * 4 + -0x30);
              plVar9 = *(long **)((long)pMVar16 + lVar22 * 4 + -0x18);
              if (plVar9 == (long *)0x0) {
                if (lVar8 != 0) {
                  free(*(void **)(lVar8 + -8));
                }
              }
              else {
                (**(code **)(*plVar9 + 8))();
              }
            }
          }
          *plVar20 = 0;
          *(undefined8 *)((long)pMVar16 + lVar22 * 4 + -0x28) = 0;
          *(size_t *)((long)pMVar16 + lVar22 * 4 + -0x20) = _elemsize;
          *(Allocator **)((long)pMVar16 + lVar22 * 4 + -0x18) = pAVar6;
          *(undefined4 *)((long)pMVar16 + lVar22 * 4 + -0x10) = 1;
          *(int *)((long)pMVar16 + lVar22 * 4 + -0xc) = iVar21;
          *(undefined8 *)((long)pMVar16 + lVar22 * 4 + -8) = 0x100000001;
          *(long *)((long)&pMVar16->data + lVar22 * 4) = lVar14;
          if (iVar21 == 0) {
            return -100;
          }
          uVar13 = _elemsize * lVar14 + 3 & 0xfffffffffffffffc;
          if (pAVar6 == (Allocator *)0x0) {
            pvVar11 = malloc(uVar13 + 0x1c);
            pvVar10 = (void *)((long)pvVar11 + 0x17U & 0xfffffffffffffff0);
            *(void **)((long)pvVar10 - 8) = pvVar11;
          }
          else {
            pvVar10 = (void *)(*(code *)**(undefined8 **)pAVar6)(pAVar6,uVar13 + 4);
          }
          *(void **)((long)pMVar16 + lVar22 * 4 + -0x30) = pvVar10;
          *(ulong *)((long)pMVar16 + lVar22 * 4 + -0x28) = (long)pvVar10 + uVar13;
          *(undefined4 *)((long)pvVar10 + uVar13) = 1;
        }
        if ((long)*(int *)((long)pMVar16 + lVar22 * 4 + -4) *
            *(long *)((long)&pMVar16->data + lVar22 * 4) == 0) {
          return -100;
        }
        memcpy(pvVar10,(void *)((long)iVar18 * 4 + (long)pMVar4->data),lVar14 * _elemsize);
        iVar18 = iVar21 + iVar18;
        uVar23 = uVar23 + 1;
        pMVar16 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        uVar13 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar16 >> 3) *
                 0x6db6db6db6db6db7;
        lVar12 = lVar12 + -1;
        lVar22 = lVar22 + 0xe;
      } while (uVar23 < uVar13);
    }
  }
  else {
    uVar3 = this->axis;
    if ((uVar17 ^ 2) == 0 && uVar3 == 0) {
      pMVar16 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      lVar12 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pMVar16;
      if (lVar12 != 0) {
        iVar2 = pMVar4->w;
        iVar18 = pMVar4->h;
        uVar23 = (lVar12 >> 3) * 0x6db6db6db6db6db7;
        lVar12 = 0;
        lVar22 = 0;
        iVar21 = 0;
        uVar13 = 0;
        do {
          iVar15 = *(int *)((long)pvVar5 + uVar13 * 4);
          if (iVar15 == -0xe9) {
            iVar15 = (int)((ulong)((long)iVar18 - (long)iVar21) / (uVar23 + lVar22));
          }
          Mat::create((Mat *)((long)&pMVar16->data + lVar12),iVar2,iVar15,_elemsize,
                      opt->blob_allocator);
          pvVar10 = *(void **)((long)&pMVar16->data + lVar12);
          if (pvVar10 == (void *)0x0) {
            return -100;
          }
          if ((long)*(int *)((long)&pMVar16->c + lVar12) * *(long *)((long)&pMVar16->cstep + lVar12)
              == 0) {
            return -100;
          }
          memcpy(pvVar10,(void *)((long)pMVar4->w * (long)iVar21 * 4 + (long)pMVar4->data),
                 (long)(iVar15 * iVar2) * _elemsize);
          iVar21 = iVar21 + iVar15;
          uVar13 = uVar13 + 1;
          pMVar16 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          uVar23 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_finish - (long)pMVar16 >> 3) *
                   0x6db6db6db6db6db7;
          lVar22 = lVar22 + -1;
          lVar12 = lVar12 + 0x38;
        } while (uVar13 < uVar23);
      }
    }
    else if ((uVar17 ^ 2) == 0 && (uVar3 ^ 1) == 0) {
      pMVar16 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      lVar12 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pMVar16;
      if (lVar12 != 0) {
        iVar2 = pMVar4->w;
        iVar18 = pMVar4->h;
        uVar13 = (lVar12 >> 3) * 0x6db6db6db6db6db7;
        iVar21 = 0;
        uVar23 = 0;
        do {
          iVar15 = *(int *)((long)pvVar5 + uVar23 * 4);
          if (iVar15 == -0xe9) {
            iVar15 = (int)((ulong)((long)iVar2 - (long)iVar21) / (uVar13 - uVar23));
          }
          pMVar1 = pMVar16 + uVar23;
          Mat::create(pMVar1,iVar15,iVar18,_elemsize,opt->blob_allocator);
          if (pMVar16[uVar23].data == (void *)0x0) {
            return -100;
          }
          if ((long)pMVar1->c * pMVar1->cstep == 0) {
            return -100;
          }
          if (0 < iVar18) {
            iVar19 = 0;
            do {
              memcpy((void *)((long)pMVar1->w * (long)iVar19 * 4 + (long)pMVar1->data),
                     (void *)((long)pMVar4->data +
                             (long)iVar21 * 4 + (long)pMVar4->w * (long)iVar19 * 4),
                     (long)iVar15 * _elemsize);
              iVar19 = iVar19 + 1;
            } while (iVar18 != iVar19);
          }
          iVar21 = iVar21 + iVar15;
          uVar23 = uVar23 + 1;
          pMVar16 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          uVar13 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_finish - (long)pMVar16 >> 3) *
                   0x6db6db6db6db6db7;
        } while (uVar23 < uVar13);
        return 0;
      }
    }
    else {
      uVar17 = uVar17 ^ 3;
      if (uVar17 == 0 && uVar3 == 0) {
        pMVar16 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        lVar12 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)pMVar16;
        if (lVar12 != 0) {
          iVar2 = pMVar4->w;
          iVar18 = pMVar4->h;
          iVar21 = pMVar4->c;
          uVar13 = (lVar12 >> 3) * 0x6db6db6db6db6db7;
          lVar12 = 0;
          lVar22 = 0;
          iVar15 = 0;
          uVar23 = 0;
          do {
            iVar19 = *(int *)((long)pvVar5 + uVar23 * 4);
            if (iVar19 == -0xe9) {
              iVar19 = (int)((ulong)((long)iVar21 - (long)iVar15) / (uVar13 + lVar22));
            }
            Mat::create((Mat *)((long)&pMVar16->data + lVar12),iVar2,iVar18,iVar19,_elemsize,
                        opt->blob_allocator);
            pvVar10 = *(void **)((long)&pMVar16->data + lVar12);
            if (pvVar10 == (void *)0x0) {
              return -100;
            }
            if ((long)*(int *)((long)&pMVar16->c + lVar12) *
                *(long *)((long)&pMVar16->cstep + lVar12) == 0) {
              return -100;
            }
            memcpy(pvVar10,(void *)(pMVar4->cstep * (long)iVar15 * pMVar4->elemsize +
                                   (long)pMVar4->data),
                   (long)(iVar19 * (int)pMVar4->cstep) * _elemsize);
            iVar15 = iVar15 + iVar19;
            uVar23 = uVar23 + 1;
            pMVar16 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_start;
            uVar13 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                            _M_impl.super__Vector_impl_data._M_finish - (long)pMVar16 >> 3) *
                     0x6db6db6db6db6db7;
            lVar22 = lVar22 + -1;
            lVar12 = lVar12 + 0x38;
          } while (uVar23 < uVar13);
          return 0;
        }
      }
      else {
        if ((uVar3 ^ 1) != 0 || uVar17 != 0) {
          if (uVar17 != 0 || uVar3 != 2) {
            return 0;
          }
          pMVar16 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          lVar12 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                         _M_impl.super__Vector_impl_data._M_finish - (long)pMVar16;
          if (lVar12 != 0) {
            iVar2 = pMVar4->w;
            uVar17 = pMVar4->h;
            uVar3 = pMVar4->c;
            uVar13 = (lVar12 >> 3) * 0x6db6db6db6db6db7;
            uVar23 = 0;
            iVar18 = 0;
            do {
              iVar21 = *(int *)((long)pvVar5 + uVar23 * 4);
              if (iVar21 == -0xe9) {
                iVar21 = (int)((ulong)((long)iVar2 - (long)iVar18) / (uVar13 - uVar23));
              }
              pMVar1 = pMVar16 + uVar23;
              Mat::create(pMVar1,iVar21,uVar17,uVar3,_elemsize,opt->blob_allocator);
              if (pMVar16[uVar23].data == (void *)0x0) {
                return -100;
              }
              if ((long)pMVar1->c * pMVar1->cstep == 0) {
                return -100;
              }
              if (0 < (int)uVar3) {
                local_a0 = 0;
                do {
                  if (0 < (int)uVar17) {
                    iVar15 = pMVar4->w;
                    pvVar10 = (void *)((long)pMVar4->data +
                                      pMVar4->cstep * pMVar4->elemsize * local_a0 + (long)iVar18 * 4
                                      );
                    pvVar11 = (void *)(pMVar1->cstep * pMVar1->elemsize * local_a0 +
                                      (long)pMVar1->data);
                    uVar13 = (ulong)uVar17;
                    do {
                      memcpy(pvVar11,pvVar10,_elemsize * (long)iVar21);
                      pvVar10 = (void *)((long)pvVar10 + (long)iVar15 * 4);
                      pvVar11 = (void *)((long)pvVar11 + (long)iVar21 * 4);
                      uVar13 = uVar13 - 1;
                    } while (uVar13 != 0);
                  }
                  local_a0 = local_a0 + 1;
                } while (local_a0 != uVar3);
              }
              iVar18 = iVar18 + iVar21;
              uVar23 = uVar23 + 1;
              pMVar16 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_start;
              uVar13 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar16 >> 3) *
                       0x6db6db6db6db6db7;
            } while (uVar23 < uVar13);
            return 0;
          }
          return 0;
        }
        pMVar16 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        lVar12 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)pMVar16;
        if (lVar12 != 0) {
          iVar2 = pMVar4->w;
          uVar17 = pMVar4->c;
          iVar18 = pMVar4->h;
          uVar13 = (lVar12 >> 3) * 0x6db6db6db6db6db7;
          uVar23 = 0;
          local_98 = 0;
          do {
            iVar21 = *(int *)((long)pvVar5 + uVar23 * 4);
            if (iVar21 == -0xe9) {
              iVar21 = (int)((ulong)((long)iVar18 - (long)local_98) / (uVar13 - uVar23));
            }
            pMVar1 = pMVar16 + uVar23;
            Mat::create(pMVar1,iVar2,iVar21,uVar17,_elemsize,opt->blob_allocator);
            if (pMVar16[uVar23].data == (void *)0x0) {
              return -100;
            }
            if ((long)pMVar1->c * pMVar1->cstep == 0) {
              return -100;
            }
            if (0 < (int)uVar17) {
              uVar13 = 0;
              do {
                memcpy((void *)(pMVar1->cstep * uVar13 * pMVar1->elemsize + (long)pMVar1->data),
                       (void *)((long)pMVar4->data +
                               (long)pMVar4->w * (long)local_98 * 4 +
                               pMVar4->cstep * uVar13 * pMVar4->elemsize),
                       (long)(iVar21 * iVar2) * _elemsize);
                uVar13 = uVar13 + 1;
              } while (uVar17 != uVar13);
            }
            local_98 = local_98 + iVar21;
            uVar23 = uVar23 + 1;
            pMVar16 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_start;
            uVar13 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                            _M_impl.super__Vector_impl_data._M_finish - (long)pMVar16 >> 3) *
                     0x6db6db6db6db6db7;
          } while (uVar23 < uVar13);
          return 0;
        }
      }
    }
  }
  return 0;
}

Assistant:

int Slice::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    const int* slices_ptr = slices;

    if (dims == 1) // axis == 0
    {
        int w = bottom_blob.w;

        int q = 0;
        for (size_t i=0; i<top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (w - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            const float* ptr = (const float*)bottom_blob + q;
            float* outptr = top_blob;
            memcpy(outptr, ptr, slice * elemsize);

            q += slice;
        }

        return 0;
    }

    if (dims == 2 && axis == 0)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        int q = 0;
        for (size_t i=0; i<top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (h - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, slice, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            int size = w * slice;

            const float* ptr = bottom_blob.row(q);
            float* outptr = top_blob;
            memcpy(outptr, ptr, size * elemsize);

            q += slice;
        }

        return 0;
    }

    if (dims == 2 && axis == 1)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        int q = 0;
        for (size_t i=0; i<top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (w - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, h, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int j=0; j<h; j++)
            {
                float* outptr = top_blob.row(j);
                const float* ptr = bottom_blob.row(j) + q;
                memcpy(outptr, ptr, slice * elemsize);
            }

            q += slice;
        }

        return 0;
    }

    if (dims == 3 && axis == 0)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i=0; i<top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (channels - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, h, slice, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            int size = bottom_blob.cstep * slice;

            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob;
            memcpy(outptr, ptr, size * elemsize);

            q += slice;
        }

        return 0;
    }

    if (dims == 3 && axis == 1)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i=0; i<top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (h - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, slice, channels, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p=0; p<channels; p++)
            {
                int size = w * slice;

                float* outptr = top_blob.channel(p);
                const float* ptr = bottom_blob.channel(p).row(q);
                memcpy(outptr, ptr, size * elemsize);
            }

            q += slice;
        }

        return 0;
    }

    if (dims == 3 && axis == 2)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i=0; i<top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = (w - q) / (top_blobs.size() - i);
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, h, channels, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p=0; p<channels; p++)
            {
                float* outptr = top_blob.channel(p);
                const Mat m = bottom_blob.channel(p);

                for (int j=0; j<h; j++)
                {
                    const float* ptr = m.row(j) + q;
                    memcpy(outptr, ptr, slice * elemsize);

                    outptr += slice;
                }
            }

            q += slice;
        }

        return 0;
    }

    return 0;
}